

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::StringPtr&,char_const(&)[14],kj::String&,char_const(&)[23],kj::String&,char_const(&)[37],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[58],unsigned_int&,char_const(&)[36]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [8],
          CppTypeName *params_2,char (*params_3) [2],StringPtr *params_4,char (*params_5) [14],
          String *params_6,char (*params_7) [23],String *params_8,char (*params_9) [37],
          CppTypeName *params_10,char (*params_11) [58],uint *params_12,char (*params_13) [36])

{
  StringTree *pSVar1;
  char (*value) [8];
  CppTypeName *pCVar2;
  char (*value_00) [2];
  StringPtr *value_01;
  char (*value_02) [14];
  String *pSVar3;
  char (*value_03) [23];
  char (*value_04) [37];
  char (*value_05) [58];
  _ *this_00;
  char (*value_06) [36];
  CppTypeName *value_07;
  CppTypeName *value_08;
  uint *value_09;
  ArrayPtr<const_char> local_130;
  CappedArray<char,_14UL> local_120;
  ArrayPtr<const_char> local_108;
  String local_f8;
  ArrayPtr<const_char> local_e0;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90 [2];
  ArrayPtr<const_char> local_70;
  String local_60;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char (*params_local_3) [2];
  CppTypeName *params_local_2;
  char (*params_local_1) [8];
  StringTree *params_local;
  
  local_38 = (StringPtr *)params_3;
  params_local_4 = (StringPtr *)params_2;
  params_local_3 = (char (*) [2])params_1;
  params_local_2 = (CppTypeName *)params;
  params_local_1 = (char (*) [8])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = ::const((char (*) [8])params_local_2);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[8]>(value);
  pCVar2 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_local_3);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_60,(_ *)pCVar2,value_07);
  value_00 = ::const((char (*) [2])params_local_4);
  local_70 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_00);
  value_01 = fwd<kj::StringPtr&>(local_38);
  local_90[0] = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_01);
  value_02 = ::const((char (*) [14])params_4);
  local_a0 = _::toStringTreeOrCharSequence<char_const(&)[14]>(value_02);
  pSVar3 = fwd<kj::String&>((String *)params_5);
  local_b0 = _::toStringTreeOrCharSequence<kj::String&>(pSVar3);
  value_03 = ::const((char (*) [23])params_6);
  local_c0 = _::toStringTreeOrCharSequence<char_const(&)[23]>(value_03);
  pSVar3 = fwd<kj::String&>((String *)params_7);
  local_d0 = _::toStringTreeOrCharSequence<kj::String&>(pSVar3);
  value_04 = ::const((char (*) [37])params_8);
  local_e0 = _::toStringTreeOrCharSequence<char_const(&)[37]>(value_04);
  pCVar2 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_9);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_f8,(_ *)pCVar2,value_08);
  value_05 = ::const((char (*) [58])params_10);
  local_108 = _::toStringTreeOrCharSequence<char_const(&)[58]>(value_05);
  this_00 = (_ *)fwd<unsigned_int&>((uint *)params_11);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_120,this_00,value_09);
  value_06 = ::const((char (*) [36])params_12);
  local_130 = _::toStringTreeOrCharSequence<char_const(&)[36]>(value_06);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pSVar1,(StringTree *)&local_48,(ArrayPtr<const_char> *)&local_60
             ,(String *)&local_70,local_90,&local_a0,&local_b0,&local_c0,&local_d0,&local_e0,
             (ArrayPtr<const_char> *)&local_f8,(String *)&local_108,
             (ArrayPtr<const_char> *)&local_120,(CappedArray<char,_14UL> *)&local_130,
             (ArrayPtr<const_char> *)&stack0xfffffffffffffdd8);
  String::~String(&local_f8);
  String::~String(&local_60);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}